

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O2

PyObject * libxml_charPtrConstWrap(char *str)

{
  PyObject *pPVar1;
  
  if (str == (char *)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    return (PyObject *)&_Py_NoneStruct;
  }
  pPVar1 = (PyObject *)PyUnicode_FromString();
  return pPVar1;
}

Assistant:

PyObject *
libxml_charPtrConstWrap(const char *str)
{
    PyObject *ret;

    if (str == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret = PY_IMPORT_STRING(str);
    return (ret);
}